

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_exception(XmlReporter *this,TestCaseException *e)

{
  XmlWriter *this_00;
  ScopedElement *this_01;
  string *text;
  string *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff18;
  lock_guard<std::mutex> *in_stack_ffffffffffffff20;
  allocator *this_02;
  string *in_stack_ffffffffffffff28;
  ScopedElement *in_stack_ffffffffffffff30;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this_00 = (XmlWriter *)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Exception",&local_41);
  XmlWriter::scopedElement(this_00,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"crash",&local_79);
  this_01 = XmlWriter::ScopedElement::writeAttribute<bool>
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (bool *)in_stack_ffffffffffffff20);
  text = (string *)String::c_str((String *)0x116b45);
  this_02 = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,(char *)text,this_02);
  XmlWriter::ScopedElement::writeText(this_01,text,SUB81((ulong)this_02 >> 0x38,0));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_02);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x116be3);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.scopedElement("Exception")
                    .writeAttribute("crash", e.is_crash)
                    .writeText(e.error_string.c_str());
        }